

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram-cache.cpp
# Opt level: O1

common_ngram_cache *
common_ngram_cache_load(common_ngram_cache *__return_storage_ptr__,string *filename)

{
  long *plVar1;
  string *psVar2;
  char *pcVar3;
  undefined8 uVar4;
  int iVar5;
  int32_t ntokens;
  int32_t count;
  llama_token token;
  common_ngram_cache_part token_counts;
  common_ngram ngram;
  ifstream hashmap_file;
  int local_29c;
  char *local_298;
  _Hashtable<common_ngram,std::pair<common_ngram_const,std::unordered_map<int,int,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,int>>>>,std::allocator<std::pair<common_ngram_const,std::unordered_map<int,int,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,int>>>>>,std::__detail::_Select1st,std::equal_to<common_ngram>,common_ngram_hash_function,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *local_290;
  undefined1 local_288 [8];
  undefined1 local_280 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  float local_260;
  undefined1 local_258 [16];
  undefined4 local_248;
  undefined4 uStack_244;
  undefined4 uStack_240;
  undefined4 uStack_23c;
  long local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream(local_238,(string *)filename,_S_bin);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
    (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
    (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
    (__return_storage_ptr__->_M_h)._M_before_begin = (_Hash_node_base *)0x0;
    (__return_storage_ptr__->_M_h)._M_element_count = 0;
    (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
    *(undefined1 (*) [16])&(__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize =
         (undefined1  [16])0x0;
    local_248 = 0xffffffff;
    uStack_244 = 0xffffffff;
    uStack_240 = 0xffffffff;
    uStack_23c = 0xffffffff;
    local_298 = "!hashmap_file.eof()";
    filename = (string *)local_288;
    local_290 = (_Hashtable<common_ngram,std::pair<common_ngram_const,std::unordered_map<int,int,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,int>>>>,std::allocator<std::pair<common_ngram_const,std::unordered_map<int,int,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,int>>>>>,std::__detail::_Select1st,std::equal_to<common_ngram>,common_ngram_hash_function,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                 *)__return_storage_ptr__;
    while( true ) {
      plVar1 = (long *)std::istream::read((char *)local_238,(long)&local_248);
      if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) != 0) break;
      if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 2) != 0) {
LAB_00104a7e:
        uVar4 = 0xf0;
        goto LAB_00104aa4;
      }
      plVar1 = (long *)std::istream::read((char *)local_238,(long)&local_29c);
      if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) != 0) {
        uVar4 = 0xf1;
        local_298 = "hashmap_file.read(ntokensc, sizeof(int32_t))";
        goto LAB_00104aa4;
      }
      if (local_29c < 1) {
        uVar4 = 0xf2;
        local_298 = "ntokens > 0";
        goto LAB_00104aa4;
      }
      local_280._0_8_ = local_258 + 8;
      local_280._8_8_ = 1;
      local_270 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   )0x0;
      local_260 = 1.0;
      local_258 = (undefined1  [16])0x0;
      if (0 < local_29c) {
        iVar5 = 0;
        do {
          if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 2) != 0) {
            uVar4 = 0xf6;
LAB_00104a46:
            pcVar3 = "!hashmap_file.eof()";
LAB_00104a69:
            ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/ngram-cache.cpp"
                       ,uVar4,"GGML_ASSERT(%s) failed",pcVar3);
            goto LAB_00104a7e;
          }
          plVar1 = (long *)std::istream::read((char *)local_238,(long)(local_288 + 4));
          if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) != 0) {
            uVar4 = 0xf7;
            pcVar3 = "hashmap_file.read(tokenc, sizeof(llama_token))";
            goto LAB_00104a69;
          }
          if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 2) != 0) {
            uVar4 = 0xf8;
            goto LAB_00104a46;
          }
          plVar1 = (long *)std::istream::read((char *)local_238,(long)filename);
          if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) != 0) {
            uVar4 = 0xf9;
            pcVar3 = "hashmap_file.read(countc, sizeof(int32_t))";
            goto LAB_00104a69;
          }
          if ((int)local_288._0_4_ < 1) {
            uVar4 = 0xfa;
            pcVar3 = "count > 0";
            goto LAB_00104a69;
          }
          std::
          _Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<int&,int&>
                    ((_Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)local_280,local_288 + 4,filename);
          iVar5 = iVar5 + 1;
        } while (iVar5 < local_29c);
      }
      std::
      _Hashtable<common_ngram,std::pair<common_ngram_const,std::unordered_map<int,int,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,int>>>>,std::allocator<std::pair<common_ngram_const,std::unordered_map<int,int,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,int>>>>>,std::__detail::_Select1st,std::equal_to<common_ngram>,common_ngram_hash_function,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_emplace<common_ngram&,std::unordered_map<int,int,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,int>>>&>
                (local_290,&local_248,
                 (_Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)local_280);
      std::
      _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_280);
    }
    if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 2) != 0) {
      std::ifstream::~ifstream(local_238);
      return (common_ngram_cache *)local_290;
    }
    local_298 = "hashmap_file.eof()";
    uVar4 = 0x100;
LAB_00104aa4:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/ngram-cache.cpp"
               ,uVar4,"GGML_ASSERT(%s) failed",local_298);
  }
  psVar2 = (string *)__cxa_allocate_exception(0x20);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280,
                 "Unable to open file ",filename);
  std::ios_base::failure[abi:cxx11]::failure(psVar2);
  __cxa_throw(psVar2,&std::ios_base::failure[abi:cxx11]::typeinfo,
              std::ios_base::failure[abi:cxx11]::~failure);
}

Assistant:

common_ngram_cache common_ngram_cache_load(std::string & filename) {
    std::ifstream hashmap_file(filename, std::ios::binary);
    if (!hashmap_file) {
        throw std::ifstream::failure("Unable to open file " + filename);
    }
    common_ngram_cache ngram_cache;

    common_ngram ngram;
    int32_t     ntokens;
    llama_token token;
    int32_t     count;

    char * ngramc   = reinterpret_cast<char*>(&ngram);
    char * ntokensc = reinterpret_cast<char*>(&ntokens);
    char * tokenc   = reinterpret_cast<char*>(&token);
    char * countc   = reinterpret_cast<char*>(&count);
    while(hashmap_file.read(ngramc, sizeof(common_ngram))) {
        GGML_ASSERT(!hashmap_file.eof());
        GGML_ASSERT(hashmap_file.read(ntokensc, sizeof(int32_t)));
        GGML_ASSERT(ntokens > 0);
        common_ngram_cache_part token_counts;

        for (int i = 0; i < ntokens; ++i) {
            GGML_ASSERT(!hashmap_file.eof());
            GGML_ASSERT(hashmap_file.read(tokenc, sizeof(llama_token)));
            GGML_ASSERT(!hashmap_file.eof());
            GGML_ASSERT(hashmap_file.read(countc, sizeof(int32_t)));
            GGML_ASSERT(count > 0);
            token_counts.emplace(token, count);
        }

        ngram_cache.emplace(ngram, token_counts);
    }
    GGML_ASSERT(hashmap_file.eof());

    return ngram_cache;
}